

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::cp_d(CPU *this)

{
  byte bVar1;
  byte bVar2;
  Registers *pRVar3;
  
  pRVar3 = this->regs;
  bVar1 = pRVar3->a;
  bVar2 = pRVar3->d;
  pRVar3->f = (bVar1 < bVar2) << 4 | ((bVar1 & 0xf) < (bVar2 & 0xf)) << 5 | 0x40;
  if (bVar1 == bVar2) {
    pRVar3->f = pRVar3->f | 0x80;
  }
  return 1;
}

Assistant:

int CPU::cp_d() {
    cp_r8(regs.d);
    return 1;
}